

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderAdjacencyTests.cpp
# Opt level: O3

void __thiscall
glcts::GeometryShaderAdjacencyTests::setLinePointsNonindiced
          (GeometryShaderAdjacencyTests *this,AdjacencyTestData *test_data)

{
  uint uVar1;
  AdjacencyGrid *pAVar2;
  AdjacencyGridLineSegment *pAVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  GLfloat *pGVar8;
  GLfloat *pGVar9;
  GLfloat *pGVar10;
  long lVar11;
  uint uVar12;
  uint uVar13;
  
  pAVar2 = test_data->m_grid;
  uVar1 = pAVar2->m_n_segments;
  test_data->m_n_vertices = uVar1 * 2;
  uVar13 = this->m_n_components_output * uVar1 * 8;
  test_data->m_geometry_bo_size = uVar13;
  uVar12 = this->m_n_components_input * uVar1 * 0x10;
  test_data->m_vertex_data_bo_size = uVar12;
  pGVar8 = (GLfloat *)operator_new__((ulong)uVar13);
  test_data->m_expected_adjacency_geometry = pGVar8;
  pGVar9 = (GLfloat *)operator_new__((ulong)uVar13);
  test_data->m_expected_geometry = pGVar9;
  pGVar10 = (GLfloat *)operator_new__((ulong)uVar12);
  test_data->m_vertex_data = pGVar10;
  if ((ulong)uVar1 != 0) {
    pAVar3 = pAVar2->m_line_segments;
    lVar11 = 0;
    do {
      lVar4 = *(long *)((long)&pAVar3->m_point_start_adjacent + lVar11);
      *(undefined4 *)((long)pGVar10 + lVar11) = *(undefined4 *)(lVar4 + 4);
      *(undefined4 *)((long)pGVar10 + lVar11 + 4) = *(undefined4 *)(lVar4 + 8);
      lVar5 = *(long *)((long)&pAVar3->m_point_start + lVar11);
      *(undefined4 *)((long)pGVar10 + lVar11 + 8) = *(undefined4 *)(lVar5 + 4);
      *(undefined4 *)((long)pGVar10 + lVar11 + 0xc) = *(undefined4 *)(lVar5 + 8);
      lVar6 = *(long *)((long)&pAVar3->m_point_end + lVar11);
      *(undefined4 *)((long)pGVar10 + lVar11 + 0x10) = *(undefined4 *)(lVar6 + 4);
      *(undefined4 *)((long)pGVar10 + lVar11 + 0x14) = *(undefined4 *)(lVar6 + 8);
      lVar7 = *(long *)((long)&pAVar3->m_point_end_adjacent + lVar11);
      *(undefined4 *)((long)pGVar10 + lVar11 + 0x18) = *(undefined4 *)(lVar7 + 4);
      *(undefined4 *)((long)pGVar10 + lVar11 + 0x1c) = *(undefined4 *)(lVar7 + 8);
      *(undefined4 *)((long)pGVar8 + lVar11) = *(undefined4 *)(lVar4 + 4);
      *(undefined4 *)((long)pGVar8 + lVar11 + 4) = *(undefined4 *)(lVar4 + 8);
      *(undefined8 *)((long)pGVar8 + lVar11 + 8) = 0x3f80000000000000;
      *(undefined4 *)((long)pGVar8 + lVar11 + 0x10) = *(undefined4 *)(lVar7 + 4);
      *(undefined4 *)((long)pGVar8 + lVar11 + 0x14) = *(undefined4 *)(lVar7 + 8);
      *(undefined8 *)((long)pGVar8 + lVar11 + 0x18) = 0x3f80000000000000;
      *(undefined4 *)((long)pGVar9 + lVar11) = *(undefined4 *)(lVar5 + 4);
      *(undefined4 *)((long)pGVar9 + lVar11 + 4) = *(undefined4 *)(lVar5 + 8);
      *(undefined8 *)((long)pGVar9 + lVar11 + 8) = 0x3f80000000000000;
      *(undefined4 *)((long)pGVar9 + lVar11 + 0x10) = *(undefined4 *)(lVar6 + 4);
      *(undefined4 *)((long)pGVar9 + lVar11 + 0x14) = *(undefined4 *)(lVar6 + 8);
      *(undefined8 *)((long)pGVar9 + lVar11 + 0x18) = 0x3f80000000000000;
      lVar11 = lVar11 + 0x20;
    } while ((ulong)uVar1 << 5 != lVar11);
  }
  return;
}

Assistant:

void GeometryShaderAdjacencyTests::setLinePointsNonindiced(AdjacencyTestData& test_data)
{
	float* travellerExpectedAdjacencyGeometryPtr = 0;
	float* travellerExpectedGeometryPtr			 = 0;
	float* travellerPtr							 = 0;

	/* Set buffer sizes */
	test_data.m_n_vertices = test_data.m_grid->m_n_segments * 2 /* start + end points form a segment */;
	test_data.m_geometry_bo_size =
		static_cast<glw::GLuint>(test_data.m_n_vertices * m_n_components_output * sizeof(float));
	test_data.m_vertex_data_bo_size = static_cast<glw::GLuint>(test_data.m_n_vertices * m_n_components_input *
															   2 /* include adjacency info */ * sizeof(float));

	/* Allocate memory for input and expected data */
	test_data.m_expected_adjacency_geometry = new float[test_data.m_geometry_bo_size / sizeof(float)];
	test_data.m_expected_geometry			= new float[test_data.m_geometry_bo_size / sizeof(float)];
	test_data.m_vertex_data					= new float[test_data.m_vertex_data_bo_size / sizeof(float)];

	travellerExpectedAdjacencyGeometryPtr = test_data.m_expected_adjacency_geometry;
	travellerExpectedGeometryPtr		  = test_data.m_expected_geometry;
	travellerPtr						  = test_data.m_vertex_data;

	/* Set input and expected values */
	for (unsigned int n = 0; n < test_data.m_grid->m_n_segments; ++n)
	{
		AdjacencyGridLineSegment* segmentPtr = test_data.m_grid->m_line_segments + n;

		*travellerPtr = segmentPtr->m_point_start_adjacent->x;
		++travellerPtr;
		*travellerPtr = segmentPtr->m_point_start_adjacent->y;
		++travellerPtr;
		*travellerPtr = segmentPtr->m_point_start->x;
		++travellerPtr;
		*travellerPtr = segmentPtr->m_point_start->y;
		++travellerPtr;
		*travellerPtr = segmentPtr->m_point_end->x;
		++travellerPtr;
		*travellerPtr = segmentPtr->m_point_end->y;
		++travellerPtr;
		*travellerPtr = segmentPtr->m_point_end_adjacent->x;
		++travellerPtr;
		*travellerPtr = segmentPtr->m_point_end_adjacent->y;
		++travellerPtr;

		*travellerExpectedAdjacencyGeometryPtr = segmentPtr->m_point_start_adjacent->x;
		++travellerExpectedAdjacencyGeometryPtr;
		*travellerExpectedAdjacencyGeometryPtr = segmentPtr->m_point_start_adjacent->y;
		++travellerExpectedAdjacencyGeometryPtr;
		*travellerExpectedAdjacencyGeometryPtr = 0;
		++travellerExpectedAdjacencyGeometryPtr;
		*travellerExpectedAdjacencyGeometryPtr = 1;
		++travellerExpectedAdjacencyGeometryPtr;
		*travellerExpectedAdjacencyGeometryPtr = segmentPtr->m_point_end_adjacent->x;
		++travellerExpectedAdjacencyGeometryPtr;
		*travellerExpectedAdjacencyGeometryPtr = segmentPtr->m_point_end_adjacent->y;
		++travellerExpectedAdjacencyGeometryPtr;
		*travellerExpectedAdjacencyGeometryPtr = 0;
		++travellerExpectedAdjacencyGeometryPtr;
		*travellerExpectedAdjacencyGeometryPtr = 1;
		++travellerExpectedAdjacencyGeometryPtr;

		*travellerExpectedGeometryPtr = segmentPtr->m_point_start->x;
		++travellerExpectedGeometryPtr;
		*travellerExpectedGeometryPtr = segmentPtr->m_point_start->y;
		++travellerExpectedGeometryPtr;
		*travellerExpectedGeometryPtr = 0;
		++travellerExpectedGeometryPtr;
		*travellerExpectedGeometryPtr = 1;
		++travellerExpectedGeometryPtr;
		*travellerExpectedGeometryPtr = segmentPtr->m_point_end->x;
		++travellerExpectedGeometryPtr;
		*travellerExpectedGeometryPtr = segmentPtr->m_point_end->y;
		++travellerExpectedGeometryPtr;
		*travellerExpectedGeometryPtr = 0;
		++travellerExpectedGeometryPtr;
		*travellerExpectedGeometryPtr = 1;
		++travellerExpectedGeometryPtr;
	} /* for (all line segments) */
}